

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardFile.cpp
# Opt level: O2

size_t __thiscall Diligent::StandardFile::GetPos(StandardFile *this)

{
  size_t sVar1;
  FILE *__stream;
  string msg;
  
  __stream = (FILE *)this->m_pFile;
  if (__stream == (FILE *)0x0) {
    FormatString<char[19]>(&msg,(char (*) [19])"File is not opened");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetPos",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/StandardFile.cpp"
               ,100);
    std::__cxx11::string::~string((string *)&msg);
    __stream = (FILE *)this->m_pFile;
    if (__stream == (FILE *)0x0) {
      return 0;
    }
  }
  sVar1 = ftell(__stream);
  return sVar1;
}

Assistant:

size_t StandardFile::GetPos()
{
    VERIFY(m_pFile, "File is not opened");
    if (!m_pFile)
        return 0;

    return ftell(m_pFile);
}